

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

void __thiscall
Camera::Camera(Camera *this,Vec3 *origin,Vec3 *lookat,Vec3 *up,float fov,float aspect,float aperture
              ,float focus_distance,float time_open,float time_close)

{
  Vec3 *v2;
  float t;
  Vec3 _half_vertical;
  Vec3 _half_horizontal;
  Vec3 local_70;
  Vec3 local_64;
  Vec3 local_58;
  Vec3 local_4c;
  Vec3 local_40;
  Vec3 local_34;
  
  (this->m_origin).e[0] = origin->e[0];
  (this->m_origin).e[1] = origin->e[1];
  (this->m_origin).e[2] = origin->e[2];
  this->m_lens_radius = aperture * 0.5;
  this->m_time_open = time_open;
  this->m_time_close = time_close;
  t = tanf(fov * 0.017453292 * 0.5);
  operator-(origin,lookat);
  unit_vector(&local_64);
  v2 = &this->m_w;
  (this->m_w).e[2] = local_58.e[2];
  *(undefined8 *)v2->e = local_58.e._0_8_;
  cross(up,v2);
  unit_vector(&local_64);
  (this->m_u).e[2] = local_58.e[2];
  *(undefined8 *)(this->m_u).e = local_58.e._0_8_;
  cross(v2,&this->m_u);
  (this->m_v).e[2] = local_58.e[2];
  *(undefined8 *)(this->m_v).e = local_58.e._0_8_;
  operator*(aspect * t,&local_64);
  operator*(&local_58,focus_distance);
  operator*(t,&local_70);
  operator*(&local_64,focus_distance);
  operator*(2.0,&local_70);
  (this->m_horizontal).e[2] = local_70.e[2];
  *(undefined8 *)(this->m_horizontal).e = local_70.e._0_8_;
  operator*(2.0,&local_70);
  (this->m_vertical).e[2] = local_70.e[2];
  *(undefined8 *)(this->m_vertical).e = local_70.e._0_8_;
  operator-(&this->m_origin,&local_58);
  operator-(&local_40,&local_64);
  operator*(&local_4c,focus_distance);
  operator-(&local_34,&local_4c);
  (this->m_lower_left_corner).e[2] = local_70.e[2];
  *(undefined8 *)(this->m_lower_left_corner).e = local_70.e._0_8_;
  return;
}

Assistant:

Camera::Camera(const Vec3& origin, const Vec3& lookat, const Vec3& up, float fov, float aspect, float aperture, float focus_distance, float time_open, float time_close)
: m_origin(origin), m_lens_radius(aperture * 0.5f), m_time_open(time_open), m_time_close(time_close)
{ 
    float _theta       = degrees_to_radians(fov);
    float _half_height = tan(_theta/2.0f);
    float _half_width  = aspect * _half_height;
    
    m_w = unit_vector(origin - lookat);
    m_u = unit_vector(cross(up, m_w));
    m_v = cross(m_w, m_u);
    
    Vec3 _half_horizontal = _half_width  * m_u * focus_distance;
    Vec3 _half_vertical   = _half_height * m_v * focus_distance;

    m_horizontal        = 2.0f * _half_horizontal;
    m_vertical          = 2.0f * _half_vertical;
    m_lower_left_corner = m_origin - _half_horizontal - _half_vertical - m_w * focus_distance;
}